

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

shared_ptr<const_ON_Mesh> * __thiscall
ON_BrepFace::SharedMesh(ON_BrepFace *this,mesh_type mesh_type)

{
  Impl *pIVar1;
  element_type *peVar2;
  int iVar3;
  recursive_mutex *__mutex;
  Impl *pIVar4;
  bool bVar5;
  
  __mutex = &this->m_pImpl->m_mesh_mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    pIVar1 = this->m_pImpl;
    pIVar4 = pIVar1;
    if (mesh_type != render_mesh) {
      if (mesh_type == preview_mesh) {
        pIVar4 = (Impl *)&pIVar1->m_preview_mesh;
      }
      else if (mesh_type == analysis_mesh) {
        pIVar4 = (Impl *)&pIVar1->m_analysis_mesh;
      }
      else {
        bVar5 = (pIVar1->m_render_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0;
        pIVar4 = (Impl *)(&(pIVar1->m_render_mesh).
                           super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> + bVar5);
        if ((&(pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)
            [bVar5]._M_ptr == (element_type *)0x0) {
          pIVar4 = (Impl *)&pIVar1->m_preview_mesh;
        }
      }
    }
    if ((pIVar4 != (Impl *)0x0) &&
       (peVar2 = (pIVar4->m_render_mesh).
                 super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar2 != (element_type *)0x0)) {
      peVar2->m_parent = (ON_Object *)this;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return &pIVar4->m_render_mesh;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

const std::shared_ptr<const ON_Mesh>& ON_BrepFace::SharedMesh(ON::mesh_type mesh_type) const
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  std::shared_ptr<const ON_Mesh>* pMesh = nullptr;

  switch (mesh_type)
  {
  case ON::render_mesh:
    pMesh = &m_pImpl->m_render_mesh;
    break;
  case ON::analysis_mesh:
    pMesh = &m_pImpl->m_analysis_mesh;
    break;
  case ON::preview_mesh:
    pMesh = &m_pImpl->m_preview_mesh;
    break;
  default:
    pMesh = m_pImpl->m_render_mesh ? &m_pImpl->m_render_mesh : &m_pImpl->m_analysis_mesh;
    if (pMesh->get() == nullptr)
    {
      pMesh = &m_pImpl->m_preview_mesh;
    }
    break;
  }

  if (pMesh && pMesh->get())
  {
    const_cast<ON_Mesh*>(pMesh->get())->m_parent = this;
  }

  return *pMesh;
}